

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

bool embree::sse42::InstanceIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  Instance *pIVar1;
  RTCRayQueryContext *pRVar2;
  long lVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  AffineSpace3ff *pAVar11;
  AffineSpace3ff *pAVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar20 [12];
  float fVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar34;
  vfloat4 l02;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  vfloat4 a0;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  RayQueryContext newcontext;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 auVar37 [16];
  
  pIVar1 = prim->instance;
  if (((ray->mask & (pIVar1->super_Geometry).mask) == 0) ||
     (pRVar2 = context->user, pRVar2->instID[0] != 0xffffffff)) {
    bVar8 = false;
  }
  else {
    pRVar2->instID[0] = prim->instID_;
    pRVar2->instPrimID[0] = 0;
    if ((pIVar1->super_Geometry).numTimeSteps == 1) {
      auVar21 = *(undefined1 (*) [16])(pIVar1->world2local0).l.vx.field_0.m128;
      auVar25 = *(undefined1 (*) [16])(pIVar1->world2local0).l.vy.field_0.m128;
      auVar30 = *(undefined1 (*) [16])(pIVar1->world2local0).l.vz.field_0.m128;
      fVar13 = (pIVar1->world2local0).p.field_0.m128[0];
      fVar26 = (pIVar1->world2local0).p.field_0.m128[1];
      fVar34 = (pIVar1->world2local0).p.field_0.m128[2];
      fVar27 = (pIVar1->world2local0).p.field_0.m128[3];
    }
    else {
      fVar13 = (pIVar1->super_Geometry).fnumTimeSegments;
      fVar26 = (pIVar1->super_Geometry).time_range.lower;
      fVar34 = (((ray->dir).field_0.m128[3] - fVar26) /
               ((pIVar1->super_Geometry).time_range.upper - fVar26)) * fVar13;
      auVar21 = roundss(ZEXT416((uint)fVar26),ZEXT416((uint)fVar34),9);
      fVar13 = fVar13 + -1.0;
      if (fVar13 <= auVar21._0_4_) {
        auVar21._0_4_ = fVar13;
      }
      fVar13 = 0.0;
      if (0.0 <= auVar21._0_4_) {
        fVar13 = auVar21._0_4_;
      }
      fVar34 = fVar34 - fVar13;
      pAVar11 = pIVar1->local2world + (uint)(int)fVar13;
      pAVar12 = pIVar1->local2world + ((int)fVar13 + 1);
      if ((pIVar1->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar13 = (pAVar11->p).field_0.m128[3];
        fVar26 = (pAVar11->l).vx.field_0.m128[3];
        fVar27 = (pAVar11->l).vy.field_0.m128[3];
        fVar28 = (pAVar11->l).vz.field_0.m128[3];
        fVar18 = (pAVar12->p).field_0.m128[3];
        fVar46 = (pAVar12->l).vx.field_0.m128[3];
        fVar32 = (pAVar12->l).vy.field_0.m128[3];
        fVar33 = (pAVar12->l).vz.field_0.m128[3];
        fVar50 = fVar28 * fVar33 + fVar27 * fVar32 + fVar13 * fVar18 + fVar26 * fVar46;
        fVar42 = -fVar50;
        if (fVar50 < fVar42) {
          fVar18 = -fVar18;
          fVar46 = -fVar46;
          fVar33 = -fVar33;
        }
        fVar39 = fVar42;
        if (fVar42 <= fVar50) {
          fVar39 = fVar50;
        }
        fVar51 = ABS(fVar50);
        fVar14 = 1.0 - fVar51;
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          fVar14 = SQRT(fVar14);
        }
        fVar19 = 1.5707964 -
                 fVar14 * (((((fVar51 * -0.0043095737 + 0.0192803) * fVar51 + -0.04489909) * fVar51
                            + 0.08785567) * fVar51 + -0.21450998) * fVar51 + 1.5707952);
        fVar14 = 0.0;
        if (0.0 <= fVar19) {
          fVar14 = fVar19;
        }
        fVar19 = (float)(-(uint)(1.0 < fVar51) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar51) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar14 & -(uint)(fVar39 < 0.0) |
                                     ~-(uint)(fVar39 < 0.0) & (uint)fVar14))) * fVar34;
        auVar21 = ZEXT416((uint)(fVar19 * 0.63661975));
        auVar21 = roundss(auVar21,auVar21,9);
        uVar9 = (uint)auVar21._0_4_;
        fVar19 = fVar19 - auVar21._0_4_ * 1.5707964;
        fVar51 = fVar19 * fVar19;
        uVar10 = uVar9 & 3;
        fVar14 = ((((fVar51 * -2.5963018e-07 + 2.4756235e-05) * fVar51 + -0.001388833) * fVar51 +
                  0.04166664) * fVar51 + -0.5) * fVar51 + 1.0;
        fVar19 = (((((fVar51 * -2.5029328e-08 + 2.7600126e-06) * fVar51 + -0.00019842605) * fVar51 +
                   0.008333348) * fVar51 + -0.16666667) * fVar51 + 1.0) * fVar19;
        fVar51 = fVar19;
        if ((uVar9 & 1) != 0) {
          fVar51 = fVar14;
          fVar14 = fVar19;
        }
        fVar32 = (float)(~-(uint)(fVar50 < fVar42) & (uint)fVar32 |
                        (uint)-fVar32 & -(uint)(fVar50 < fVar42));
        if (1 < uVar10) {
          fVar51 = -fVar51;
        }
        if (uVar10 - 1 < 2) {
          fVar14 = -fVar14;
        }
        fVar42 = fVar39 * fVar13 - fVar18;
        fVar44 = fVar39 * fVar26 - fVar46;
        fVar41 = fVar39 * fVar27 - fVar32;
        fVar19 = fVar39 * fVar28 - fVar33;
        auVar25._4_4_ = 0x80000000;
        auVar25._0_4_ = fVar19;
        auVar25._8_4_ = 0x80000000;
        auVar25._12_4_ = 0x80000000;
        auVar30._4_12_ = auVar25._4_12_;
        auVar30._0_4_ = fVar19 * fVar19 + fVar41 * fVar41 + fVar42 * fVar42 + fVar44 * fVar44;
        auVar49._4_4_ = 0x80000000;
        auVar49._0_4_ = auVar30._0_4_;
        auVar49._8_4_ = 0x80000000;
        auVar49._12_4_ = 0x80000000;
        auVar21 = rsqrtss(auVar49,auVar30);
        fVar50 = auVar21._0_4_;
        fVar45 = fVar50 * fVar50 * auVar30._0_4_ * -0.5 * fVar50 + fVar50 * 1.5;
        fVar52 = 1.0 - fVar34;
        fVar50 = fVar13 * fVar52 + fVar18 * fVar34;
        fVar43 = fVar52 * fVar26 + fVar46 * fVar34;
        fVar18 = fVar52 * fVar27 + fVar32 * fVar34;
        fVar46 = fVar52 * fVar28 + fVar33 * fVar34;
        fVar33 = fVar46 * fVar46 + fVar18 * fVar18 + fVar50 * fVar50 + fVar43 * fVar43;
        auVar21 = rsqrtss(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
        fVar32 = auVar21._0_4_;
        fVar32 = fVar32 * fVar32 * fVar33 * -0.5 * fVar32 + fVar32 * 1.5;
        fVar13 = (float)(-(uint)(0.9995 < fVar39) & (uint)(fVar50 * fVar32) |
                        ~-(uint)(0.9995 < fVar39) &
                        (uint)(fVar14 * fVar13 - fVar42 * fVar45 * fVar51));
        if (0.9995 < fVar39) {
          fVar43 = fVar43 * fVar32;
          fVar18 = fVar18 * fVar32;
          fVar46 = fVar46 * fVar32;
        }
        else {
          fVar43 = fVar26 * fVar14 - fVar44 * fVar45 * fVar51;
          fVar18 = fVar27 * fVar14 - fVar41 * fVar45 * fVar51;
          fVar46 = fVar28 * fVar14 - fVar19 * fVar45 * fVar51;
        }
        fVar26 = (pAVar11->l).vx.field_0.m128[0] * fVar52 + (pAVar12->l).vx.field_0.m128[0] * fVar34
        ;
        auVar31._0_4_ =
             (pAVar11->l).vy.field_0.m128[0] * fVar52 + (pAVar12->l).vy.field_0.m128[0] * fVar34;
        auVar31._4_4_ =
             (pAVar11->l).vy.field_0.m128[1] * fVar52 + (pAVar12->l).vy.field_0.m128[1] * fVar34;
        auVar31._8_4_ =
             (pAVar11->l).vy.field_0.m128[2] * fVar52 + (pAVar12->l).vy.field_0.m128[2] * fVar34;
        auVar31._12_4_ =
             (pAVar11->l).vy.field_0.m128[3] * fVar52 + (pAVar12->l).vy.field_0.m128[3] * fVar34;
        fVar28 = (pAVar11->l).vz.field_0.m128[0] * fVar52 + (pAVar12->l).vz.field_0.m128[0] * fVar34
        ;
        fVar32 = (pAVar11->l).vz.field_0.m128[1] * fVar52 + (pAVar12->l).vz.field_0.m128[1] * fVar34
        ;
        fVar33 = (pAVar11->l).vz.field_0.m128[2] * fVar52 + (pAVar12->l).vz.field_0.m128[2] * fVar34
        ;
        fVar53 = fVar52 * (pAVar11->p).field_0.m128[0] + fVar34 * (pAVar12->p).field_0.m128[0];
        fVar54 = fVar52 * (pAVar11->p).field_0.m128[1] + fVar34 * (pAVar12->p).field_0.m128[1];
        fVar55 = fVar52 * (pAVar11->p).field_0.m128[2] + fVar34 * (pAVar12->p).field_0.m128[2];
        fVar42 = fVar13 * fVar13 + fVar43 * fVar43 + -fVar18 * fVar18 + -fVar46 * fVar46;
        fVar14 = fVar43 * fVar18 + fVar13 * fVar46;
        fVar39 = fVar43 * fVar18 - fVar13 * fVar46;
        fVar27 = fVar13 * fVar13 - fVar43 * fVar43;
        fVar45 = fVar18 * fVar18 + fVar27 + -fVar46 * fVar46;
        fVar51 = fVar43 * fVar46 - fVar13 * fVar18;
        fVar44 = fVar13 * fVar18 + fVar43 * fVar46;
        fVar41 = fVar18 * fVar46 + fVar13 * fVar43;
        fVar13 = fVar18 * fVar46 - fVar13 * fVar43;
        fVar14 = fVar14 + fVar14;
        fVar51 = fVar51 + fVar51;
        fVar27 = fVar46 * fVar46 + fVar27 + -fVar18 * fVar18;
        fVar18 = fVar42 * 1.0 + fVar14 * 0.0 + fVar51 * 0.0;
        fVar46 = fVar42 * 0.0 + fVar14 * 1.0 + fVar51 * 0.0;
        fVar50 = fVar42 * 0.0 + fVar14 * 0.0 + fVar51 * 1.0;
        fVar42 = fVar42 * 0.0 + fVar14 * 0.0 + fVar51 * 0.0;
        fVar41 = fVar41 + fVar41;
        fVar39 = fVar39 + fVar39;
        fVar14 = fVar39 * 1.0 + fVar45 * 0.0 + fVar41 * 0.0;
        fVar51 = fVar39 * 0.0 + fVar45 * 1.0 + fVar41 * 0.0;
        fVar19 = fVar39 * 0.0 + fVar45 * 0.0 + fVar41 * 1.0;
        fVar39 = fVar39 * 0.0 + fVar45 * 0.0 + fVar41 * 0.0;
        auVar40._4_4_ =
             (pAVar11->l).vx.field_0.m128[2] * fVar52 + (pAVar12->l).vx.field_0.m128[2] * fVar34;
        auVar40._0_4_ =
             (pAVar11->l).vx.field_0.m128[1] * fVar52 + (pAVar12->l).vx.field_0.m128[1] * fVar34;
        auVar40._8_8_ = 0;
        auVar21 = blendps(auVar40,auVar31,4);
        fVar44 = fVar44 + fVar44;
        fVar13 = fVar13 + fVar13;
        fVar34 = fVar44 * 1.0 + fVar13 * 0.0 + fVar27 * 0.0;
        fVar52 = fVar44 * 0.0 + fVar13 * 1.0 + fVar27 * 0.0;
        fVar47 = fVar44 * 0.0 + fVar13 * 0.0 + fVar27 * 1.0;
        fVar48 = fVar44 * 0.0 + fVar13 * 0.0 + fVar27 * 0.0;
        fVar13 = fVar48 * 0.0;
        auVar15._0_4_ = fVar26 * fVar18 + fVar14 * 0.0 + fVar34 * 0.0;
        auVar15._4_4_ = fVar26 * fVar46 + fVar51 * 0.0 + fVar52 * 0.0;
        auVar15._8_4_ = fVar26 * fVar50 + fVar19 * 0.0 + fVar47 * 0.0;
        auVar15._12_4_ = fVar26 * fVar42 + fVar39 * 0.0 + fVar13;
        fVar41 = auVar31._0_4_ * fVar18 + auVar31._4_4_ * fVar14 + fVar34 * 0.0;
        fVar43 = auVar31._0_4_ * fVar46 + auVar31._4_4_ * fVar51 + fVar52 * 0.0;
        fVar44 = auVar31._0_4_ * fVar50 + auVar31._4_4_ * fVar19 + fVar47 * 0.0;
        fVar45 = auVar31._0_4_ * fVar42 + auVar31._4_4_ * fVar39 + fVar13;
        fVar13 = fVar28 * fVar18 + fVar32 * fVar14 + fVar33 * fVar34;
        fVar26 = fVar28 * fVar46 + fVar32 * fVar51 + fVar33 * fVar52;
        fVar27 = fVar28 * fVar50 + fVar32 * fVar19 + fVar33 * fVar47;
        fVar28 = fVar28 * fVar42 + fVar32 * fVar39 + fVar33 * fVar48;
        auVar20._0_4_ = fVar53 * fVar18 + fVar54 * fVar14 + fVar55 * fVar34 + auVar21._0_4_ + 0.0;
        auVar20._4_4_ = fVar53 * fVar46 + fVar54 * fVar51 + fVar55 * fVar52 + auVar21._4_4_ + 0.0;
        auVar20._8_4_ = fVar53 * fVar50 + fVar54 * fVar19 + fVar55 * fVar47 + auVar21._8_4_ + 0.0;
      }
      else {
        fVar18 = 1.0 - fVar34;
        auVar15._0_4_ =
             (pAVar11->l).vx.field_0.m128[0] * fVar18 + (pAVar12->l).vx.field_0.m128[0] * fVar34;
        auVar15._4_4_ =
             (pAVar11->l).vx.field_0.m128[1] * fVar18 + (pAVar12->l).vx.field_0.m128[1] * fVar34;
        auVar15._8_4_ =
             (pAVar11->l).vx.field_0.m128[2] * fVar18 + (pAVar12->l).vx.field_0.m128[2] * fVar34;
        auVar15._12_4_ =
             (pAVar11->l).vx.field_0.m128[3] * fVar18 + (pAVar12->l).vx.field_0.m128[3] * fVar34;
        fVar41 = (pAVar11->l).vy.field_0.m128[0] * fVar18 + (pAVar12->l).vy.field_0.m128[0] * fVar34
        ;
        fVar43 = (pAVar11->l).vy.field_0.m128[1] * fVar18 + (pAVar12->l).vy.field_0.m128[1] * fVar34
        ;
        fVar44 = (pAVar11->l).vy.field_0.m128[2] * fVar18 + (pAVar12->l).vy.field_0.m128[2] * fVar34
        ;
        fVar45 = (pAVar11->l).vy.field_0.m128[3] * fVar18 + (pAVar12->l).vy.field_0.m128[3] * fVar34
        ;
        fVar13 = (pAVar11->l).vz.field_0.m128[0] * fVar18 + (pAVar12->l).vz.field_0.m128[0] * fVar34
        ;
        fVar26 = (pAVar11->l).vz.field_0.m128[1] * fVar18 + (pAVar12->l).vz.field_0.m128[1] * fVar34
        ;
        fVar27 = (pAVar11->l).vz.field_0.m128[2] * fVar18 + (pAVar12->l).vz.field_0.m128[2] * fVar34
        ;
        fVar28 = (pAVar11->l).vz.field_0.m128[3] * fVar18 + (pAVar12->l).vz.field_0.m128[3] * fVar34
        ;
        auVar20._0_4_ =
             fVar18 * (pAVar11->p).field_0.m128[0] + fVar34 * (pAVar12->p).field_0.m128[0];
        auVar20._4_4_ =
             fVar18 * (pAVar11->p).field_0.m128[1] + fVar34 * (pAVar12->p).field_0.m128[1];
        auVar20._8_4_ =
             fVar18 * (pAVar11->p).field_0.m128[2] + fVar34 * (pAVar12->p).field_0.m128[2];
      }
      fVar34 = auVar15._0_4_;
      fVar18 = auVar15._4_4_;
      fVar46 = auVar15._8_4_;
      auVar29._0_4_ = fVar41 * fVar26 - fVar43 * fVar13;
      fVar32 = fVar43 * fVar27 - fVar44 * fVar26;
      fVar33 = fVar44 * fVar13 - fVar41 * fVar27;
      auVar35._4_4_ = fVar33;
      auVar35._0_4_ = fVar32;
      auVar35._8_4_ = auVar29._0_4_;
      auVar35._12_4_ = fVar45 * fVar28 - fVar45 * fVar28;
      auVar24._0_4_ = fVar13 * fVar18 - fVar26 * fVar34;
      auVar24._4_4_ = fVar26 * fVar46 - fVar27 * fVar18;
      auVar24._8_4_ = fVar27 * fVar34 - fVar13 * fVar46;
      auVar24._12_4_ = fVar28 * auVar15._12_4_ - fVar28 * auVar15._12_4_;
      fVar13 = fVar18 * fVar44 - fVar46 * fVar43;
      auVar21 = dpps(auVar15,auVar35,0x7f);
      auVar25 = insertps(auVar24,auVar24,0x4a);
      auVar29._4_4_ = auVar24._0_4_;
      auVar29._8_4_ = fVar34 * fVar43 - fVar18 * fVar41;
      auVar29._12_4_ = 0;
      auVar38._4_4_ = fVar13;
      auVar38._0_4_ = fVar32;
      auVar38._8_4_ = fVar13;
      auVar38._12_4_ = auVar25._4_4_;
      auVar37._8_8_ = auVar38._8_8_;
      auVar37._4_4_ = auVar25._0_4_;
      auVar37._0_4_ = fVar32;
      auVar36._4_4_ = auVar25._8_4_;
      auVar36._0_4_ = fVar33;
      auVar36._8_4_ = fVar46 * fVar41 - fVar34 * fVar44;
      auVar36._12_4_ = auVar25._12_4_;
      auVar16._0_4_ = auVar21._0_4_;
      auVar16._4_4_ = auVar16._0_4_;
      auVar16._8_4_ = auVar16._0_4_;
      auVar16._12_4_ = auVar16._0_4_;
      auVar21 = divps(auVar37,auVar16);
      auVar25 = divps(auVar36,auVar16);
      auVar30 = divps(auVar29,auVar16);
      fVar27 = auVar20._0_4_;
      fVar28 = auVar20._4_4_;
      fVar18 = auVar20._8_4_;
      fVar13 = -(fVar27 * auVar21._0_4_ + fVar28 * auVar25._0_4_ + fVar18 * auVar30._0_4_);
      fVar26 = -(fVar27 * auVar21._4_4_ + fVar28 * auVar25._4_4_ + fVar18 * auVar30._4_4_);
      fVar34 = -(fVar27 * auVar21._8_4_ + fVar28 * auVar25._8_4_ + fVar18 * auVar30._8_4_);
      fVar27 = -(fVar27 * auVar21._12_4_ + fVar28 * auVar25._12_4_ + fVar18 * auVar30._12_4_);
    }
    fVar28 = (ray->org).field_0.m128[0];
    fVar18 = (ray->org).field_0.m128[1];
    fVar46 = (ray->org).field_0.m128[2];
    auVar20 = *(undefined1 (*) [12])&(ray->org).field_0;
    aVar5 = (ray->org).field_0;
    fVar32 = (ray->dir).field_0.m128[0];
    fVar33 = (ray->dir).field_0.m128[1];
    uVar6 = *(undefined8 *)&(ray->dir).field_0;
    pfVar4 = (ray->dir).field_0.m128 + 2;
    fVar42 = *pfVar4;
    uVar7 = *(undefined8 *)pfVar4;
    auVar22._0_4_ =
         fVar28 * auVar21._0_4_ + fVar18 * auVar25._0_4_ + fVar46 * auVar30._0_4_ + fVar13;
    auVar22._4_4_ =
         fVar28 * auVar21._4_4_ + fVar18 * auVar25._4_4_ + fVar46 * auVar30._4_4_ + fVar26;
    auVar22._8_4_ =
         fVar28 * auVar21._8_4_ + fVar18 * auVar25._8_4_ + fVar46 * auVar30._8_4_ + fVar34;
    auVar22._12_4_ =
         fVar28 * auVar21._12_4_ + fVar18 * auVar25._12_4_ + fVar46 * auVar30._12_4_ + fVar27;
    aVar23 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar22,(ray->org).field_0.m128[3],0x30);
    (ray->org).field_0 = aVar23;
    auVar17._0_4_ = fVar32 * auVar21._0_4_ + fVar33 * auVar25._0_4_ + fVar42 * auVar30._0_4_;
    auVar17._4_4_ = fVar32 * auVar21._4_4_ + fVar33 * auVar25._4_4_ + fVar42 * auVar30._4_4_;
    auVar17._8_4_ = fVar32 * auVar21._8_4_ + fVar33 * auVar25._8_4_ + fVar42 * auVar30._8_4_;
    auVar17._12_4_ = fVar32 * auVar21._12_4_ + fVar33 * auVar25._12_4_ + fVar42 * auVar30._12_4_;
    aVar23 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar17,(ray->dir).field_0.m128[3],0x30);
    (ray->dir).field_0 = aVar23;
    lVar3 = *(long *)&(pIVar1->super_Geometry).field_0x58;
    (**(code **)(lVar3 + 0x80))(lVar3 + 0x58,ray);
    local_108 = auVar20._0_8_;
    uStack_100 = aVar5._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_108;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_100;
    *(undefined8 *)&(ray->dir).field_0 = uVar6;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uVar7;
    bVar8 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar2->instID[0] = 0xffffffff;
    pRVar2->instPrimID[0] = 0xffffffff;
  }
  return bVar8;
}

Assistant:

bool InstanceIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }